

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::WriteMatrixSpmv(ChSystemDescriptor *this,string *path,string *prefix)

{
  double *pdVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  double *pdVar5;
  long *plVar6;
  Index size;
  pointer ppCVar7;
  _func_int **pp_Var8;
  undefined1 (*pauVar9) [16];
  long *plVar10;
  char *__function;
  long lVar11;
  Index IVar12;
  long lVar13;
  long lVar14;
  ulong rows;
  ulong uVar15;
  ChVectorDynamic<> e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ChVectorDynamic<> v;
  ChMatrixDynamic<> A;
  string filename;
  ChVectorDynamic<double> rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ChSparseMatrix Z;
  ChStreamOutAsciiFile file_rhs;
  ChStreamOutAsciiFile file_Z;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_728;
  long *local_718;
  long local_710;
  long local_708;
  long lStack_700;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_6f8;
  DenseStorage<double,__1,__1,__1,_1> local_6e8;
  string *local_6d0;
  char *local_6c8;
  undefined8 local_6c0;
  char local_6b8;
  undefined7 uStack_6b7;
  long local_6a8;
  long lStack_6a0;
  long *local_690 [2];
  long local_680 [2];
  _func_int **local_670;
  string *local_668;
  undefined1 local_660 [32];
  StorageIndex *pSStack_640;
  StorageIndex *pSStack_638;
  CompressedStorage<double,_int> CStack_630;
  undefined1 local_610 [16];
  _func_int *local_600;
  long lStack_5f8;
  ChStreamOutAscii local_340;
  undefined1 local_320 [16];
  undefined1 local_310 [44] [16];
  ChStreamOutAscii local_50;
  
  local_6c8 = &local_6b8;
  local_6c0 = 0;
  local_6b8 = '\0';
  iVar4 = 0;
  for (ppCVar7 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar7 !=
      (this->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
    iVar4 = iVar4 + (uint)(*ppCVar7)->active;
  }
  local_6e8.m_cols = 0;
  local_6e8.m_data = (double *)0x0;
  local_6e8.m_rows = 0;
  rows = (long)iVar4 + (long)this->n_q;
  local_6d0 = path;
  if ((int)rows < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6e8,rows * rows,rows,rows);
  local_6f8.m_storage.m_data = (double *)0x0;
  local_6f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_6f8,rows);
  local_728.m_storage.m_data = (double *)0x0;
  local_728.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_728,rows);
  IVar12 = local_728.m_storage.m_rows;
  local_668 = prefix;
  if (local_728.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_728.m_storage.m_rows != 0) {
    memset(local_728.m_storage.m_data,0,local_728.m_storage.m_rows * 8);
  }
  if ((int)rows != 0) {
    lVar11 = 0;
    uVar15 = 0;
    do {
      if (IVar12 <= (long)uVar15) {
LAB_007964e8:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_728.m_storage.m_data[uVar15] = 1.0;
      (*this->_vptr_ChSystemDescriptor[0x17])(this,&local_6f8,&local_728);
      if (local_6e8.m_rows < 0 && local_6e8.m_data != (double *)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_0079655a;
      }
      if (local_6e8.m_cols <= (long)uVar15) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_6e8.m_rows != local_6f8.m_storage.m_rows) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      if (0 < local_6e8.m_rows) {
        pdVar5 = (double *)((long)local_6e8.m_data + lVar11);
        lVar14 = 0;
        do {
          pdVar1 = local_6f8.m_storage.m_data + lVar14;
          lVar14 = lVar14 + 1;
          *pdVar5 = *pdVar1;
          pdVar5 = pdVar5 + local_6e8.m_cols;
        } while (local_6e8.m_rows != lVar14);
      }
      if (local_728.m_storage.m_rows <= (long)uVar15) goto LAB_007964e8;
      lVar11 = lVar11 + 8;
      local_728.m_storage.m_data[uVar15] = 0.0;
      uVar15 = uVar15 + 1;
      IVar12 = local_728.m_storage.m_rows;
    } while (uVar15 != (rows & 0xffffffff));
  }
  local_310[0] = vmovhps_avx(ZEXT816(0) << 0x40,0x3d719799812dea11);
  local_320._8_8_ = &local_6e8;
  local_320._0_8_ = local_320._0_8_ & 0xffffffffffffff00;
  local_660[8] = false;
  local_660._0_8_ = &PTR_SetElement_00b0c488;
  register0x00001200 = ZEXT864(0) << 0x20;
  Eigen::internal::
  assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseView<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((SparseMatrix<double,_1,_int> *)local_660,
             (SparseView<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_320);
  pcVar2 = (local_6d0->_M_dataplus)._M_p;
  local_718 = &local_708;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_718,pcVar2,pcVar2 + local_6d0->_M_string_length);
  psVar3 = local_668;
  std::__cxx11::string::append((char *)&local_718);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_718,(ulong)(psVar3->_M_dataplus)._M_p);
  pp_Var8 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var8) {
    local_600 = *pp_Var8;
    lStack_5f8 = plVar6[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var8;
    local_610._0_8_ = (_func_int **)*plVar6;
  }
  local_610._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_610);
  local_670 = (_func_int **)&PTR_SetElement_00b0c488;
  pauVar9 = (undefined1 (*) [16])(plVar6 + 2);
  if ((undefined1 (*) [16])*plVar6 == pauVar9) {
    local_310[0] = *pauVar9;
    local_320._0_8_ = local_310;
  }
  else {
    local_310[0]._0_8_ = *(long *)*pauVar9;
    local_320._0_8_ = (undefined1 (*) [16])*plVar6;
  }
  local_320._8_8_ = plVar6[1];
  *plVar6 = (long)pauVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6c8,(string *)local_320);
  if ((undefined1 (*) [16])local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,local_310[0]._0_8_ + 1);
  }
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,local_708 + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320,local_6c8,_S_trunc);
  builtin_strncpy(local_50.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat((ChSparseMatrix *)local_660,&local_50);
  local_6a8 = 0;
  lStack_6a0 = 0;
  (*this->_vptr_ChSystemDescriptor[0x1c])(this,0);
  pcVar2 = (local_6d0->_M_dataplus)._M_p;
  local_690[0] = local_680;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_690,pcVar2,pcVar2 + local_6d0->_M_string_length);
  std::__cxx11::string::append((char *)local_690);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_690,(ulong)(psVar3->_M_dataplus)._M_p);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_708 = *plVar10;
    lStack_700 = plVar6[3];
    local_718 = &local_708;
  }
  else {
    local_708 = *plVar10;
    local_718 = (long *)*plVar6;
  }
  local_710 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_718);
  pp_Var8 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var8) {
    local_600 = *pp_Var8;
    lStack_5f8 = plVar6[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var8;
    local_610._0_8_ = (_func_int **)*plVar6;
  }
  local_610._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6c8,(string *)local_610);
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,local_708 + 1);
  }
  if (local_690[0] != local_680) {
    operator_delete(local_690[0],local_680[0] + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610,local_6c8,_S_trunc);
  lVar14 = lStack_6a0;
  lVar11 = local_6a8;
  builtin_strncpy(local_340.number_format,"%.12g",6);
  if (-1 < lStack_6a0 || local_6a8 == 0) {
    if (0 < lStack_6a0) {
      lVar13 = 0;
      do {
        if (lVar14 <= lVar13) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        ChStreamOutAscii::operator<<(&local_340,*(double *)(lVar11 + lVar13 * 8));
        ChStreamOutAscii::operator<<(&local_340,"\n");
        lVar13 = lVar13 + 1;
      } while (lVar14 != lVar13);
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610);
    if (local_6a8 != 0) {
      free(*(void **)(local_6a8 + -8));
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320);
    local_660._0_8_ = local_670;
    free(pSStack_640);
    free(pSStack_638);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&CStack_630);
    if (local_728.m_storage.m_data != (double *)0x0) {
      free((void *)local_728.m_storage.m_data[-1]);
    }
    if (local_6f8.m_storage.m_data != (double *)0x0) {
      free((void *)local_6f8.m_storage.m_data[-1]);
    }
    if (local_6e8.m_data != (double *)0x0) {
      free((void *)local_6e8.m_data[-1]);
    }
    if (local_6c8 != &local_6b8) {
      operator_delete(local_6c8,CONCAT71(uStack_6b7,local_6b8) + 1);
    }
    return;
  }
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
  ;
LAB_0079655a:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

void ChSystemDescriptor::WriteMatrixSpmv(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    // Count constraints.
    int mn_c = 0;
    for (auto& cnstr : vconstraints) {
        if (cnstr->IsActive())
            mn_c++;
    }

    // Generate dense system matrix, column by column
    int size = n_q + mn_c;
    ChMatrixDynamic<> A(size, size);
    ChVectorDynamic<> v(size);
    ChVectorDynamic<> e(size);
    e.setZero();

    for (int i = 0; i < size; i++) {
        e[i] = 1;
        SystemProduct(v, e);
        A.col(i) = v;
        e[i] = 0;
    }

    // Convert to Eigen sparse matrix
    ChSparseMatrix Z = A.sparseView();

    // Write sparse matrix to file
    filename = path + "/" + prefix + "_Z.dat";
    ChStreamOutAsciiFile file_Z(filename.c_str());
    file_Z.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(Z, file_Z);

    // Write RHS to file
    ChVectorDynamic<double> rhs;
    ConvertToMatrixForm(nullptr, &rhs);
    filename = path + "/" + prefix + "_rhs.dat";
    ChStreamOutAsciiFile file_rhs(filename.c_str());
    file_rhs.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(rhs, file_rhs);
}